

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_pri_stack_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  int local_1390;
  int local_1338;
  int local_12e0;
  int local_1288;
  int local_1230;
  int local_11d8;
  int local_1180;
  int local_1128;
  int local_10d0;
  int local_1078;
  int local_1020;
  int local_fc8;
  long local_f78;
  REF_INT local_f68;
  long local_f60;
  long local_f40;
  long local_f10;
  REF_INT local_f00;
  long local_ef8;
  long local_ed8;
  long local_ea8;
  REF_INT local_e98;
  long local_e90;
  long local_e70;
  long local_e40;
  REF_INT local_e30;
  long local_e28;
  long local_e08;
  long local_dd8;
  REF_INT local_dc8;
  long local_dc0;
  long local_da0;
  long local_d70;
  REF_INT local_d60;
  long local_d58;
  long local_d38;
  int local_d00;
  int local_ca8;
  int local_c50;
  int local_bf8;
  int local_ba0;
  int local_b48;
  long local_af8;
  REF_INT local_ae8;
  long local_ae0;
  long local_ac0;
  long local_a90;
  REF_INT local_a80;
  long local_a78;
  long local_a58;
  long local_a28;
  REF_INT local_a18;
  long local_a10;
  long local_9f0;
  long local_9c0;
  REF_INT local_9b0;
  long local_9a8;
  long local_988;
  long local_958;
  REF_INT local_948;
  long local_940;
  long local_920;
  long local_8f0;
  REF_INT local_8e0;
  long local_8d8;
  long local_8b8;
  int local_880;
  int local_828;
  int local_7d0;
  int local_778;
  int local_720;
  int local_6c8;
  long local_678;
  REF_INT local_668;
  long local_660;
  long local_640;
  long local_610;
  REF_INT local_600;
  long local_5f8;
  long local_5d8;
  long local_5a8;
  REF_INT local_598;
  long local_590;
  long local_570;
  long local_540;
  REF_INT local_530;
  long local_528;
  long local_508;
  long local_4d8;
  REF_INT local_4c8;
  long local_4c0;
  long local_4a0;
  long local_470;
  REF_INT local_460;
  long local_458;
  long local_438;
  int local_400;
  int local_3a8;
  int local_350;
  int local_2f8;
  int local_2a0;
  int local_248;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GLOB nnodesg;
  int local_178;
  REF_INT cell;
  REF_INT local [27];
  REF_GLOB global [27];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x303
           ,"ref_fixture_pri_stack_grid",(ulong)uVar2,"create");
    return uVar2;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node_00 = pRVar1->node;
  stack0xfffffffffffffef8 = 0;
  if (0 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
      0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
    local_248 = (int)(0 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
  }
  else {
    local_248 = (int)(-((0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                       (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
  }
  if (ref_mpi->id == local_248) {
LAB_00137387:
    uVar2 = ref_node_add(ref_node_00,0,&local_178);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x319,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local_178 * 0xf] = 0.0;
    ref_node_00->real[local_178 * 0xf + 1] = 0.0;
    ref_node_00->real[local_178 * 0xf + 2] = 0.0;
    if (((local_178 < 0) || (ref_node_00->max <= local_178)) || (ref_node_00->global[local_178] < 0)
       ) {
      local_438 = -1;
    }
    else {
      local_438 = ref_node_00->global[local_178];
    }
    if (local_438 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local_178 < 0) || (ref_node_00->max <= local_178)) ||
         (ref_node_00->global[local_178] < 0)) {
        local_458 = -1;
      }
      else {
        local_458 = ref_node_00->global[local_178];
      }
      local_460 = (REF_INT)(local_458 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local_178 < 0) || (ref_node_00->max <= local_178)) ||
         (ref_node_00->global[local_178] < 0)) {
        local_470 = -1;
      }
      else {
        local_470 = ref_node_00->global[local_178];
      }
      local_460 = (int)((local_470 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local_178] = local_460;
    uVar2 = ref_node_add(ref_node_00,1,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x31a,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 1.0;
    ref_node_00->real[cell * 0xf + 1] = 0.0;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_4a0 = -1;
    }
    else {
      local_4a0 = ref_node_00->global[cell];
    }
    if (local_4a0 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_4c0 = -1;
      }
      else {
        local_4c0 = ref_node_00->global[cell];
      }
      local_4c8 = (REF_INT)(local_4c0 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_4d8 = -1;
      }
      else {
        local_4d8 = ref_node_00->global[cell];
      }
      local_4c8 = (int)((local_4d8 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[cell] = local_4c8;
    uVar2 = ref_node_add(ref_node_00,2,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x31b,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 0.0;
    ref_node_00->real[local[0] * 0xf + 1] = 1.0;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_508 = -1;
    }
    else {
      local_508 = ref_node_00->global[local[0]];
    }
    if (local_508 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_528 = -1;
      }
      else {
        local_528 = ref_node_00->global[local[0]];
      }
      local_530 = (REF_INT)(local_528 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_540 = -1;
      }
      else {
        local_540 = ref_node_00->global[local[0]];
      }
      local_530 = (int)((local_540 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_530;
    uVar2 = ref_node_add(ref_node_00,3,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x31c,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[1] * 0xf] = 0.0;
    ref_node_00->real[local[1] * 0xf + 1] = 0.0;
    ref_node_00->real[local[1] * 0xf + 2] = 1.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_570 = -1;
    }
    else {
      local_570 = ref_node_00->global[local[1]];
    }
    if (local_570 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_590 = -1;
      }
      else {
        local_590 = ref_node_00->global[local[1]];
      }
      local_598 = (REF_INT)(local_590 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_5a8 = -1;
      }
      else {
        local_5a8 = ref_node_00->global[local[1]];
      }
      local_598 = (int)((local_5a8 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_598;
    uVar2 = ref_node_add(ref_node_00,4,local + 2);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x31d,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[2] * 0xf] = 1.0;
    ref_node_00->real[local[2] * 0xf + 1] = 0.0;
    ref_node_00->real[local[2] * 0xf + 2] = 1.0;
    if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0)) {
      local_5d8 = -1;
    }
    else {
      local_5d8 = ref_node_00->global[local[2]];
    }
    if (local_5d8 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0))
      {
        local_5f8 = -1;
      }
      else {
        local_5f8 = ref_node_00->global[local[2]];
      }
      local_600 = (REF_INT)(local_5f8 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0))
      {
        local_610 = -1;
      }
      else {
        local_610 = ref_node_00->global[local[2]];
      }
      local_600 = (int)((local_610 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[2]] = local_600;
    uVar2 = ref_node_add(ref_node_00,5,local + 3);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x31e,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[3] * 0xf] = 0.0;
    ref_node_00->real[local[3] * 0xf + 1] = 1.0;
    ref_node_00->real[local[3] * 0xf + 2] = 1.0;
    if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0)) {
      local_640 = -1;
    }
    else {
      local_640 = ref_node_00->global[local[3]];
    }
    if (local_640 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0))
      {
        local_660 = -1;
      }
      else {
        local_660 = ref_node_00->global[local[3]];
      }
      local_668 = (REF_INT)(local_660 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0))
      {
        local_678 = -1;
      }
      else {
        local_678 = ref_node_00->global[local[3]];
      }
      local_668 = (int)((local_678 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[3]] = local_668;
    uVar2 = ref_cell_add(pRVar1->cell[10],&local_178,(REF_INT *)((long)&nnodesg + 4));
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",800
             ,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add prism");
      return uVar2;
    }
  }
  else {
    if (1 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_2a0 = (int)(1 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_2a0 = (int)((1 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_2a0) goto LAB_00137387;
    if (2 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_2f8 = (int)(2 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_2f8 = (int)((2 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_2f8) goto LAB_00137387;
    if (3 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_350 = (int)(3 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_350 = (int)((3 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_350) goto LAB_00137387;
    if (4 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_3a8 = (int)(4 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_3a8 = (int)((4 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_3a8) goto LAB_00137387;
    if (5 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_400 = (int)(5 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_400 = (int)((5 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_400) goto LAB_00137387;
  }
  stack0xfffffffffffffef8 = 3;
  if (3 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
      0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
    local_6c8 = (int)(3 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
  }
  else {
    local_6c8 = (int)((3 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                           (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)
                     ) + (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
  }
  if (ref_mpi->id == local_6c8) {
LAB_001396ba:
    uVar2 = ref_node_add(ref_node_00,3,&local_178);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x335,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local_178 * 0xf] = 0.0;
    ref_node_00->real[local_178 * 0xf + 1] = 0.0;
    ref_node_00->real[local_178 * 0xf + 2] = 1.0;
    if (((local_178 < 0) || (ref_node_00->max <= local_178)) || (ref_node_00->global[local_178] < 0)
       ) {
      local_8b8 = -1;
    }
    else {
      local_8b8 = ref_node_00->global[local_178];
    }
    if (local_8b8 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local_178 < 0) || (ref_node_00->max <= local_178)) ||
         (ref_node_00->global[local_178] < 0)) {
        local_8d8 = -1;
      }
      else {
        local_8d8 = ref_node_00->global[local_178];
      }
      local_8e0 = (REF_INT)(local_8d8 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local_178 < 0) || (ref_node_00->max <= local_178)) ||
         (ref_node_00->global[local_178] < 0)) {
        local_8f0 = -1;
      }
      else {
        local_8f0 = ref_node_00->global[local_178];
      }
      local_8e0 = (int)((local_8f0 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local_178] = local_8e0;
    uVar2 = ref_node_add(ref_node_00,4,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x336,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 1.0;
    ref_node_00->real[cell * 0xf + 1] = 0.0;
    ref_node_00->real[cell * 0xf + 2] = 1.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_920 = -1;
    }
    else {
      local_920 = ref_node_00->global[cell];
    }
    if (local_920 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_940 = -1;
      }
      else {
        local_940 = ref_node_00->global[cell];
      }
      local_948 = (REF_INT)(local_940 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_958 = -1;
      }
      else {
        local_958 = ref_node_00->global[cell];
      }
      local_948 = (int)((local_958 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[cell] = local_948;
    uVar2 = ref_node_add(ref_node_00,5,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x337,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 0.0;
    ref_node_00->real[local[0] * 0xf + 1] = 1.0;
    ref_node_00->real[local[0] * 0xf + 2] = 1.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_988 = -1;
    }
    else {
      local_988 = ref_node_00->global[local[0]];
    }
    if (local_988 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_9a8 = -1;
      }
      else {
        local_9a8 = ref_node_00->global[local[0]];
      }
      local_9b0 = (REF_INT)(local_9a8 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_9c0 = -1;
      }
      else {
        local_9c0 = ref_node_00->global[local[0]];
      }
      local_9b0 = (int)((local_9c0 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_9b0;
    uVar2 = ref_node_add(ref_node_00,6,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x338,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[1] * 0xf] = 0.0;
    ref_node_00->real[local[1] * 0xf + 1] = 0.0;
    ref_node_00->real[local[1] * 0xf + 2] = 2.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_9f0 = -1;
    }
    else {
      local_9f0 = ref_node_00->global[local[1]];
    }
    if (local_9f0 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_a10 = -1;
      }
      else {
        local_a10 = ref_node_00->global[local[1]];
      }
      local_a18 = (REF_INT)(local_a10 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_a28 = -1;
      }
      else {
        local_a28 = ref_node_00->global[local[1]];
      }
      local_a18 = (int)((local_a28 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_a18;
    uVar2 = ref_node_add(ref_node_00,7,local + 2);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x339,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[2] * 0xf] = 1.0;
    ref_node_00->real[local[2] * 0xf + 1] = 0.0;
    ref_node_00->real[local[2] * 0xf + 2] = 2.0;
    if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0)) {
      local_a58 = -1;
    }
    else {
      local_a58 = ref_node_00->global[local[2]];
    }
    if (local_a58 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0))
      {
        local_a78 = -1;
      }
      else {
        local_a78 = ref_node_00->global[local[2]];
      }
      local_a80 = (REF_INT)(local_a78 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0))
      {
        local_a90 = -1;
      }
      else {
        local_a90 = ref_node_00->global[local[2]];
      }
      local_a80 = (int)((local_a90 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[2]] = local_a80;
    uVar2 = ref_node_add(ref_node_00,8,local + 3);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x33a,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[3] * 0xf] = 0.0;
    ref_node_00->real[local[3] * 0xf + 1] = 1.0;
    ref_node_00->real[local[3] * 0xf + 2] = 2.0;
    if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0)) {
      local_ac0 = -1;
    }
    else {
      local_ac0 = ref_node_00->global[local[3]];
    }
    if (local_ac0 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0))
      {
        local_ae0 = -1;
      }
      else {
        local_ae0 = ref_node_00->global[local[3]];
      }
      local_ae8 = (REF_INT)(local_ae0 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0))
      {
        local_af8 = -1;
      }
      else {
        local_af8 = ref_node_00->global[local[3]];
      }
      local_ae8 = (int)((local_af8 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[3]] = local_ae8;
    uVar2 = ref_cell_add(pRVar1->cell[10],&local_178,(REF_INT *)((long)&nnodesg + 4));
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x33c,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add prism");
      return uVar2;
    }
  }
  else {
    if (4 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_720 = (int)(4 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_720 = (int)((4 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_720) goto LAB_001396ba;
    if (5 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_778 = (int)(5 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_778 = (int)((5 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_778) goto LAB_001396ba;
    if (6 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_7d0 = (int)(6 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_7d0 = (int)((6 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_7d0) goto LAB_001396ba;
    if (7 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_828 = (int)(7 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_828 = (int)((7 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_828) goto LAB_001396ba;
    if (8 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_880 = (int)(8 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_880 = (int)((8 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_880) goto LAB_001396ba;
  }
  stack0xfffffffffffffef8 = 6;
  if (6 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
      0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
    local_b48 = (int)(6 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
  }
  else {
    local_b48 = (int)((6 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                           (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)
                     ) + (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
  }
  if (ref_mpi->id == local_b48) {
LAB_0013b9fc:
    uVar2 = ref_node_add(ref_node_00,6,&local_178);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x351,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local_178 * 0xf] = 0.0;
    ref_node_00->real[local_178 * 0xf + 1] = 0.0;
    ref_node_00->real[local_178 * 0xf + 2] = 2.0;
    if (((local_178 < 0) || (ref_node_00->max <= local_178)) || (ref_node_00->global[local_178] < 0)
       ) {
      local_d38 = -1;
    }
    else {
      local_d38 = ref_node_00->global[local_178];
    }
    if (local_d38 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local_178 < 0) || (ref_node_00->max <= local_178)) ||
         (ref_node_00->global[local_178] < 0)) {
        local_d58 = -1;
      }
      else {
        local_d58 = ref_node_00->global[local_178];
      }
      local_d60 = (REF_INT)(local_d58 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local_178 < 0) || (ref_node_00->max <= local_178)) ||
         (ref_node_00->global[local_178] < 0)) {
        local_d70 = -1;
      }
      else {
        local_d70 = ref_node_00->global[local_178];
      }
      local_d60 = (int)((local_d70 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local_178] = local_d60;
    uVar2 = ref_node_add(ref_node_00,7,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x352,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 1.0;
    ref_node_00->real[cell * 0xf + 1] = 0.0;
    ref_node_00->real[cell * 0xf + 2] = 2.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_da0 = -1;
    }
    else {
      local_da0 = ref_node_00->global[cell];
    }
    if (local_da0 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_dc0 = -1;
      }
      else {
        local_dc0 = ref_node_00->global[cell];
      }
      local_dc8 = (REF_INT)(local_dc0 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_dd8 = -1;
      }
      else {
        local_dd8 = ref_node_00->global[cell];
      }
      local_dc8 = (int)((local_dd8 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[cell] = local_dc8;
    uVar2 = ref_node_add(ref_node_00,8,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x353,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 0.0;
    ref_node_00->real[local[0] * 0xf + 1] = 1.0;
    ref_node_00->real[local[0] * 0xf + 2] = 2.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_e08 = -1;
    }
    else {
      local_e08 = ref_node_00->global[local[0]];
    }
    if (local_e08 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_e28 = -1;
      }
      else {
        local_e28 = ref_node_00->global[local[0]];
      }
      local_e30 = (REF_INT)(local_e28 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_e40 = -1;
      }
      else {
        local_e40 = ref_node_00->global[local[0]];
      }
      local_e30 = (int)((local_e40 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_e30;
    uVar2 = ref_node_add(ref_node_00,9,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x354,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[1] * 0xf] = 0.0;
    ref_node_00->real[local[1] * 0xf + 1] = 0.0;
    ref_node_00->real[local[1] * 0xf + 2] = 3.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_e70 = -1;
    }
    else {
      local_e70 = ref_node_00->global[local[1]];
    }
    if (local_e70 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_e90 = -1;
      }
      else {
        local_e90 = ref_node_00->global[local[1]];
      }
      local_e98 = (REF_INT)(local_e90 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_ea8 = -1;
      }
      else {
        local_ea8 = ref_node_00->global[local[1]];
      }
      local_e98 = (int)((local_ea8 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_e98;
    uVar2 = ref_node_add(ref_node_00,10,local + 2);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x355,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[2] * 0xf] = 1.0;
    ref_node_00->real[local[2] * 0xf + 1] = 0.0;
    ref_node_00->real[local[2] * 0xf + 2] = 3.0;
    if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0)) {
      local_ed8 = -1;
    }
    else {
      local_ed8 = ref_node_00->global[local[2]];
    }
    if (local_ed8 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0))
      {
        local_ef8 = -1;
      }
      else {
        local_ef8 = ref_node_00->global[local[2]];
      }
      local_f00 = (REF_INT)(local_ef8 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[2] < 0) || (ref_node_00->max <= local[2])) || (ref_node_00->global[local[2]] < 0))
      {
        local_f10 = -1;
      }
      else {
        local_f10 = ref_node_00->global[local[2]];
      }
      local_f00 = (int)((local_f10 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[2]] = local_f00;
    uVar2 = ref_node_add(ref_node_00,0xb,local + 3);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x356,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[3] * 0xf] = 0.0;
    ref_node_00->real[local[3] * 0xf + 1] = 1.0;
    ref_node_00->real[local[3] * 0xf + 2] = 3.0;
    if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0)) {
      local_f40 = -1;
    }
    else {
      local_f40 = ref_node_00->global[local[3]];
    }
    if (local_f40 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0))
      {
        local_f60 = -1;
      }
      else {
        local_f60 = ref_node_00->global[local[3]];
      }
      local_f68 = (REF_INT)(local_f60 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      if (((local[3] < 0) || (ref_node_00->max <= local[3])) || (ref_node_00->global[local[3]] < 0))
      {
        local_f78 = -1;
      }
      else {
        local_f78 = ref_node_00->global[local[3]];
      }
      local_f68 = (int)((local_f78 -
                        (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                        (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    ref_node_00->part[local[3]] = local_f68;
    uVar2 = ref_cell_add(pRVar1->cell[10],&local_178,(REF_INT *)((long)&nnodesg + 4));
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x358,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add prism");
      return uVar2;
    }
  }
  else {
    if (7 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_ba0 = (int)(7 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_ba0 = (int)((7 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_ba0) goto LAB_0013b9fc;
    if (8 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_bf8 = (int)(8 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_bf8 = (int)((8 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_bf8) goto LAB_0013b9fc;
    if (9 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_c50 = (int)(9 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_c50 = (int)((9 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                             (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_c50) goto LAB_0013b9fc;
    if (10 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_ca8 = (int)(10 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_ca8 = (int)((10 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                              (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_ca8) goto LAB_0013b9fc;
    if (0xb / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_d00 = (int)(0xb / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_d00 = (int)((0xb - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                               (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                       (0xb / (long)ref_mpi->n)) +
                  (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_d00) goto LAB_0013b9fc;
  }
  uVar2 = ref_node_initialize_n_global(ref_node_00,0xc);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x35b
           ,"ref_fixture_pri_stack_grid",(ulong)uVar2,"glob");
    return uVar2;
  }
  stack0xfffffffffffffef8 = 1;
  if (1 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
      0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
    local_fc8 = (int)(1 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
  }
  else {
    local_fc8 = (int)((1 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                           (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n)
                     ) + (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
  }
  if (ref_mpi->id == local_fc8) {
LAB_0013d99e:
    uVar2 = ref_node_local(ref_node_00,1,&local_178);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x36a,"ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
      return uVar2;
    }
    uVar2 = ref_node_local(ref_node_00,0,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x36b,"ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
      return uVar2;
    }
    uVar2 = ref_node_local(ref_node_00,3,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x36c,"ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
      return uVar2;
    }
    uVar2 = ref_node_local(ref_node_00,4,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x36d,"ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
      return uVar2;
    }
    local[2] = 0x14;
    uVar2 = ref_cell_add(pRVar1->cell[6],&local_178,(REF_INT *)((long)&nnodesg + 4));
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x36f,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add quad");
      return uVar2;
    }
  }
  else {
    if (0 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_1020 = (int)(0 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_1020 = (int)(-((0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                          (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) / (0xb / (long)ref_mpi->n))
                   + (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_1020) goto LAB_0013d99e;
    if (3 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_1078 = (int)(3 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_1078 = (int)((3 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                              (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                        (0xb / (long)ref_mpi->n)) +
                   (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_1078) goto LAB_0013d99e;
    if (4 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_10d0 = (int)(4 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_10d0 = (int)((4 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                              (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                        (0xb / (long)ref_mpi->n)) +
                   (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id == local_10d0) goto LAB_0013d99e;
  }
  stack0xfffffffffffffef8 = 4;
  if (4 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
      0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
    local_1128 = (int)(4 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
  }
  else {
    local_1128 = (int)((4 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                            (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                      (0xb / (long)ref_mpi->n)) + (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n))
    ;
  }
  if (ref_mpi->id != local_1128) {
    if (3 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_1180 = (int)(3 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_1180 = (int)((3 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                              (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                        (0xb / (long)ref_mpi->n)) +
                   (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id != local_1180) {
      if (6 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
          0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
        local_11d8 = (int)(6 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
      }
      else {
        local_11d8 = (int)((6 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                                (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                          (0xb / (long)ref_mpi->n)) +
                     (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
      }
      if (ref_mpi->id != local_11d8) {
        if (7 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
            0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
          local_1230 = (int)(7 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
        }
        else {
          local_1230 = (int)((7 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                                  (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                            (0xb / (long)ref_mpi->n)) +
                       (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
        }
        if (ref_mpi->id != local_1230) goto LAB_0013e5df;
      }
    }
  }
  uVar2 = ref_node_local(ref_node_00,4,&local_178);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x37f
           ,"ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,3,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x380
           ,"ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,6,local);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x381
           ,"ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,7,local + 1);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x382
           ,"ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  local[2] = 0x14;
  uVar2 = ref_cell_add(pRVar1->cell[6],&local_178,(REF_INT *)((long)&nnodesg + 4));
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",900,
           "ref_fixture_pri_stack_grid",(ulong)uVar2,"add quad");
    return uVar2;
  }
LAB_0013e5df:
  stack0xfffffffffffffef8 = 7;
  if (7 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
      0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
    local_1288 = (int)(7 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
  }
  else {
    local_1288 = (int)((7 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                            (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                      (0xb / (long)ref_mpi->n)) + (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n))
    ;
  }
  if (ref_mpi->id != local_1288) {
    if (6 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
        0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
      local_12e0 = (int)(6 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
    }
    else {
      local_12e0 = (int)((6 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                              (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                        (0xb / (long)ref_mpi->n)) +
                   (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
    }
    if (ref_mpi->id != local_12e0) {
      if (9 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
          0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
        local_1338 = (int)(9 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
      }
      else {
        local_1338 = (int)((9 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                                (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                          (0xb / (long)ref_mpi->n)) +
                     (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
      }
      if (ref_mpi->id != local_1338) {
        if (10 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n) <
            0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) {
          local_1390 = (int)(10 / (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n));
        }
        else {
          local_1390 = (int)((10 - (0xc - (long)ref_mpi->n * (0xb / (long)ref_mpi->n)) *
                                   (((long)ref_mpi->n + 0xb) / (long)ref_mpi->n)) /
                            (0xb / (long)ref_mpi->n)) +
                       (0xc - ref_mpi->n * (int)(0xb / (long)ref_mpi->n));
        }
        if (ref_mpi->id != local_1390) {
          return 0;
        }
      }
    }
  }
  uVar2 = ref_node_local(ref_node_00,7,&local_178);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x394
           ,"ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  uVar2 = ref_node_local(ref_node_00,6,&cell);
  if (uVar2 == 0) {
    uVar2 = ref_node_local(ref_node_00,9,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x396,"ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
      return uVar2;
    }
    uVar2 = ref_node_local(ref_node_00,10,local + 1);
    if (uVar2 == 0) {
      local[2] = 0x14;
      uVar2 = ref_cell_add(pRVar1->cell[6],&local_178,(REF_INT *)((long)&nnodesg + 4));
      if (uVar2 == 0) {
        return 0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x399,"ref_fixture_pri_stack_grid",(ulong)uVar2,"add quad");
      return uVar2;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x397
           ,"ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
    return uVar2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x395,
         "ref_fixture_pri_stack_grid",(ulong)uVar2,"loc");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_stack_grid(REF_GRID *ref_grid_ptr,
                                              REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_GLOB global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_GLOB nnodesg = 12;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);
    add_that_node(4, 1.0, 0.0, 1.0);
    add_that_node(5, 0.0, 1.0, 1.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  global[4] = 7;
  global[5] = 8;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 1.0);
    add_that_node(1, 1.0, 0.0, 1.0);
    add_that_node(2, 0.0, 1.0, 1.0);
    add_that_node(3, 0.0, 0.0, 2.0);
    add_that_node(4, 1.0, 0.0, 2.0);
    add_that_node(5, 0.0, 1.0, 2.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 6;
  global[1] = 7;
  global[2] = 8;
  global[3] = 9;
  global[4] = 10;
  global[5] = 11;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 2.0);
    add_that_node(1, 1.0, 0.0, 2.0);
    add_that_node(2, 0.0, 1.0, 2.0);
    add_that_node(3, 0.0, 0.0, 3.0);
    add_that_node(4, 1.0, 0.0, 3.0);
    add_that_node(5, 0.0, 1.0, 3.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "glob");

  global[0] = 1;
  global[1] = 0;
  global[2] = 3;
  global[3] = 4;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 4;
  global[1] = 3;
  global[2] = 6;
  global[3] = 7;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 7;
  global[1] = 6;
  global[2] = 9;
  global[3] = 10;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  return REF_SUCCESS;
}